

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O1

CordzInfo * __thiscall absl::lts_20250127::cord_internal::InlineData::cordz_info(InlineData *this)

{
  ulong uVar1;
  
  if (((this->rep_).field_0.data[0] & 1U) == 0) {
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x242,"CordzInfo *absl::cord_internal::InlineData::cordz_info() const");
  }
  uVar1 = (this->rep_).field_0.as_tree.cordz_info;
  if ((uVar1 & 1) != 0) {
    return (CordzInfo *)(uVar1 - 1);
  }
  __assert_fail("info & 1",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0x245,"CordzInfo *absl::cord_internal::InlineData::cordz_info() const");
}

Assistant:

CordzInfo* cordz_info() const {
    assert(is_tree());
    intptr_t info = static_cast<intptr_t>(absl::little_endian::ToHost64(
        static_cast<uint64_t>(rep_.cordz_info())));
    assert(info & 1);
    return reinterpret_cast<CordzInfo*>(info - 1);
  }